

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

void __thiscall
vkt::texture::SampleVerifier::getMipmapStepBounds
          (SampleVerifier *this,Vec2 *lodFracBounds,deInt32 *stepMin,deInt32 *stepMax)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  iVar2 = 1 << ((byte)this->m_mipmapBits & 0x1f);
  fVar3 = floorf(lodFracBounds->m_data[0] * (float)iVar2);
  *stepMin = (int)fVar3;
  fVar3 = ceilf((float)iVar2 * lodFracBounds->m_data[1]);
  *stepMax = (int)fVar3;
  iVar1 = 0;
  if (0 < *stepMin) {
    iVar1 = *stepMin;
  }
  *stepMin = iVar1;
  if (*stepMax < iVar2) {
    iVar2 = *stepMax;
  }
  *stepMax = iVar2;
  return;
}

Assistant:

void SampleVerifier::getMipmapStepBounds (const Vec2&	lodFracBounds,
										  deInt32&		stepMin,
										  deInt32&		stepMax) const
{
	DE_ASSERT(m_mipmapBits < 32);
	const int mipmapSteps = ((int)1) << m_mipmapBits;

	stepMin = deFloorFloatToInt32(lodFracBounds[0] * (float)mipmapSteps);
	stepMax = deCeilFloatToInt32 (lodFracBounds[1] * (float)mipmapSteps);

	stepMin = de::max(stepMin, (deInt32)0);
	stepMax = de::min(stepMax, (deInt32)mipmapSteps);
}